

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O1

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  uint uVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  ulong uVar9;
  upd7759_state *chip;
  
  pDVar3 = *outputs;
  pDVar4 = outputs[1];
  uVar9 = 0;
  if (samples != 0 && *(char *)((long)param + 0x38) != '\0') {
    uVar9 = 0;
    do {
      iVar6 = 0;
      if (*(char *)((long)param + 0x80) == '\0') {
        iVar6 = (int)*(short *)((long)param + 0x5e) << 7;
      }
      pDVar3[uVar9] = iVar6;
      pDVar4[uVar9] = iVar6;
      *(int *)((long)param + 0x24) = *(int *)((long)param + 0x24) + *(int *)((long)param + 0x28);
      if (*(int *)((long)param + 0x58) == 0) {
        do {
          if ((*(long *)((long)param + 0x68) == 0) ||
             (uVar8 = *(uint *)((long)param + 0x24), uVar8 < 0x100000)) break;
          uVar7 = uVar8 >> 0x14;
          uVar2 = *(uint *)((long)param + 0x3c);
          uVar5 = uVar2;
          if ((int)uVar7 < (int)uVar2) {
            uVar5 = uVar7;
          }
          *(uint *)((long)param + 0x24) = uVar8 + uVar5 * -0x100000;
          *(uint *)((long)param + 0x3c) = uVar2 - uVar5;
        } while (((int)uVar7 < (int)uVar2) ||
                (advance_state((upd7759_state *)param), *(char *)((long)param + 0x38) != '\0'));
      }
      else {
        while( true ) {
          uVar8 = *(uint *)((long)param + 0x24);
          iVar6 = *(int *)((long)param + 0x3c);
          if ((int)(uVar8 >> 0x14) < iVar6) break;
          *(uint *)((long)param + 0x24) = uVar8 + iVar6 * -0x100000;
          *(undefined4 *)((long)param + 0x3c) = 0;
          cVar1 = *(char *)((long)param + 0x2f);
          advance_state((upd7759_state *)param);
          if ((cVar1 != *(char *)((long)param + 0x2f)) &&
             (*(code **)((long)param + 0x30) != (code *)0x0)) {
            (**(code **)((long)param + 0x30))(param);
          }
        }
        *(uint *)((long)param + 0x3c) = iVar6 - (uVar8 >> 0x14);
        *(uint *)((long)param + 0x24) = uVar8 & 0xfffff;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != samples);
  }
  uVar8 = samples - (uint)uVar9;
  if (samples < (uint)uVar9 || uVar8 == 0) {
    return;
  }
  __n = (ulong)uVar8 << 2;
  memset(pDVar3 + (uVar9 & 0xffffffff),0,__n);
  memset(pDVar4 + (uVar9 & 0xffffffff),0,__n);
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			INT16 sample = chip->Muted ? 0 : chip->sample;
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			chip->pos += chip->step;

			if (chip->mode == MODE_STAND_ALONE)
			{
				/* handle clocks, but only in standalone mode */
				while (chip->rom != NULL && chip->pos >= FRAC_ONE)
				{
					int clocks_this_time = chip->pos >> FRAC_BITS;
					if (clocks_this_time > chip->clocks_left)
						clocks_this_time = chip->clocks_left;

					/* clock once */
					chip->pos -= clocks_this_time * FRAC_ONE;
					chip->clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (chip->clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;
					}
				}
			}
			else
			{
				while(chip->clocks_left <= (INT32)(chip->pos >> FRAC_BITS))
				{
					chip->pos -= chip->clocks_left << FRAC_BITS;
					chip->clocks_left = 0;
					upd7759_slave_update(chip);
				}
				chip->clocks_left -= (chip->pos >> FRAC_BITS);
				chip->pos &= FRAC_MASK;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}
}